

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

istream * utility::read<std::vector<signed_char,std::allocator<signed_char>>>
                    (istream *stream,vector<signed_char,_std::allocator<signed_char>_> *values)

{
  pointer pcVar1;
  long *plVar2;
  char *value;
  pointer pcVar3;
  int64_t n;
  size_t size;
  undefined8 local_30;
  size_type local_28;
  
  local_28 = 0;
  plVar2 = (long *)std::istream::read((char *)stream,(long)&local_28);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(values,local_28);
    pcVar3 = (values->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (values->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar3 != pcVar1) {
      do {
        local_30 = 0;
        std::istream::read((char *)stream,(long)&local_30);
        *pcVar3 = (char)local_30;
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 != pcVar1);
    }
  }
  return stream;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }